

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::
make_container<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value&>
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,chaiscript *this,Boxed_Value *t)

{
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> c;
  
  c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve(&c,1);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
            (&c,(value_type *)this);
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_start =
       c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  c.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&c);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr auto make_container(T &&...t) {
    Container c;
    c.reserve(sizeof...(t));
    (c.push_back(std::forward<T>(t)), ...);
    return c;
  }